

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_example.cpp
# Opt level: O1

int main(void)

{
  undefined1 *puVar1;
  ulong uVar2;
  undefined8 uVar3;
  pointer pBVar4;
  uint uVar5;
  pointer puVar6;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  __first;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  __last;
  void *pvVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  float fVar10;
  float fVar11;
  float fVar12;
  pointer pBVar13;
  long lVar14;
  pointer puVar15;
  ulong uVar16;
  ostream *poVar17;
  long lVar18;
  ulong uVar19;
  long lVar20;
  int iVar21;
  uint uVar22;
  unsigned_long uVar23;
  ulong uVar24;
  code *__new_size;
  size_t i;
  ulong uVar25;
  bool bVar26;
  undefined1 auVar27 [16];
  undefined1 in_ZmmResult [64];
  undefined1 auVar30 [48];
  undefined1 auVar28 [64];
  float fVar31;
  float fVar32;
  float fVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  _Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_madmann91[P]bvh_src_bvh_v2_sweep_sah_builder_h:60:71)>
  __comp;
  _Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_madmann91[P]bvh_src_bvh_v2_sweep_sah_builder_h:60:71)>
  __comp_00;
  vector<bvh::v2::Tri<float,_3UL>,_std::allocator<bvh::v2::Tri<float,_3UL>_>_> tris;
  SequentialExecutor executor;
  vector<bvh::v2::PrecomputedTri<float>,_std::allocator<bvh::v2::PrecomputedTri<float>_>_>
  precomputed_tris;
  vector<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
  mini_trees;
  vector<bvh::v2::Vec<float,_3UL>,_std::allocator<bvh::v2::Vec<float,_3UL>_>_> centers;
  vector<bvh::v2::BBox<float,_3UL>,_std::allocator<bvh::v2::BBox<float,_3UL>_>_> bboxes;
  SmallStack<bvh::v2::Index<32UL,_4UL>,_64U> stack;
  Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_> bvh;
  Config config;
  ThreadPool thread_pool;
  void *local_3e8;
  void *pvStack_3e0;
  long local_3d8;
  undefined1 local_3c8 [8];
  undefined8 uStack_3c0;
  undefined8 local_3b8;
  undefined8 local_3b0;
  ThreadPool *local_3a8;
  __extent_storage<18446744073709551615UL> local_3a0;
  _Any_data *local_398;
  vector<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
  local_388;
  undefined1 local_370 [8];
  pointer pBStack_368;
  pointer local_360;
  ulong local_358;
  pointer local_350;
  float local_348;
  float local_344;
  float local_340;
  float local_33c;
  float local_338;
  float local_334;
  float local_330;
  float local_32c;
  vector<bvh::v2::Vec<float,_3UL>,_std::allocator<bvh::v2::Vec<float,_3UL>_>_> local_328;
  vector<bvh::v2::BBox<float,_3UL>,_std::allocator<bvh::v2::BBox<float,_3UL>_>_> local_310;
  _Any_data local_2f8;
  code *pcStack_2e8;
  ThreadPool *pTStack_2e0;
  ulong local_2d8;
  undefined8 local_2d0;
  vector<bool,_std::allocator<bool>_> local_2c8;
  vector<float,_std::allocator<float>_> vStack_2a0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> vStack_288;
  pointer pfStack_270;
  pointer pfStack_268;
  pointer puStack_260;
  undefined8 uStack_258;
  undefined8 uStack_250;
  undefined8 uStack_248;
  uint local_1f8;
  Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_> local_1f0;
  long local_1c0;
  long local_1b8;
  long local_1b0;
  long local_1a8;
  long local_1a0;
  long local_198;
  vector<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
  local_190;
  Config local_178;
  int local_150;
  undefined8 local_148;
  undefined1 local_138 [16];
  undefined1 local_128 [8];
  __native_type local_120;
  pointer local_f8;
  pointer local_f0;
  unique_lock local_b0 [48];
  deque<std::function<void(unsigned_long)>,std::allocator<std::function<void(unsigned_long)>>>
  local_80 [16];
  _Elt_pointer local_70;
  _Elt_pointer local_50;
  undefined1 auVar29 [64];
  
  local_3e8 = (void *)0x0;
  pvStack_3e0 = (void *)0x0;
  local_3d8 = 0;
  local_2f8._M_unused._M_object = (void *)0xbf8000003f800000;
  local_2f8._8_4_ = 0x3f800000;
  local_128 = (undefined1  [8])0x3f8000003f800000;
  local_120.__data.__lock = 0x3f800000;
  local_3c8 = (undefined1  [8])0x3f800000bf800000;
  uStack_3c0._0_4_ = 1.0;
  std::vector<bvh::v2::Tri<float,3ul>,std::allocator<bvh::v2::Tri<float,3ul>>>::
  emplace_back<bvh::v2::Vec<float,3ul>,bvh::v2::Vec<float,3ul>,bvh::v2::Vec<float,3ul>>
            ((vector<bvh::v2::Tri<float,3ul>,std::allocator<bvh::v2::Tri<float,3ul>>> *)&local_3e8,
             (Vec<float,_3UL> *)&local_2f8,(Vec<float,_3UL> *)local_128,(Vec<float,_3UL> *)local_3c8
            );
  local_2f8._M_unused._M_object = (void *)0xbf8000003f800000;
  local_2f8._8_4_ = 0x3f800000;
  local_128 = (undefined1  [8])0xbf800000bf800000;
  local_120.__data.__lock = 0x3f800000;
  local_3c8 = (undefined1  [8])0x3f800000bf800000;
  uStack_3c0._0_4_ = 1.0;
  std::vector<bvh::v2::Tri<float,3ul>,std::allocator<bvh::v2::Tri<float,3ul>>>::
  emplace_back<bvh::v2::Vec<float,3ul>,bvh::v2::Vec<float,3ul>,bvh::v2::Vec<float,3ul>>
            ((vector<bvh::v2::Tri<float,3ul>,std::allocator<bvh::v2::Tri<float,3ul>>> *)&local_3e8,
             (Vec<float,_3UL> *)&local_2f8,(Vec<float,_3UL> *)local_128,(Vec<float,_3UL> *)local_3c8
            );
  ::bvh::v2::ThreadPool::ThreadPool((ThreadPool *)local_128,0);
  std::vector<bvh::v2::BBox<float,_3UL>,_std::allocator<bvh::v2::BBox<float,_3UL>_>_>::vector
            (&local_310,((long)pvStack_3e0 - (long)local_3e8 >> 2) * -0x71c71c71c71c71c7,
             (allocator_type *)local_2f8._M_pod_data);
  std::vector<bvh::v2::Vec<float,_3UL>,_std::allocator<bvh::v2::Vec<float,_3UL>_>_>::vector
            (&local_328,((long)pvStack_3e0 - (long)local_3e8 >> 2) * -0x71c71c71c71c71c7,
             (allocator_type *)local_2f8._M_pod_data);
  uVar24 = ((long)pvStack_3e0 - (long)local_3e8 >> 2) * -0x71c71c71c71c71c7;
  if (uVar24 < 0x400) {
    if (pvStack_3e0 != local_3e8) {
      lVar14 = 0x10;
      lVar18 = 0;
      do {
        auVar34._8_8_ = 0;
        auVar34._0_8_ = *(ulong *)((long)local_3e8 + lVar14 * 2 + -0x20);
        auVar36 = ZEXT416(*(uint *)((long)local_3e8 + lVar14 * 2 + -0x14));
        auVar27 = vminss_avx(auVar34,auVar36);
        auVar39 = vmovshdup_avx(auVar34);
        auVar37 = ZEXT416(*(uint *)((long)local_3e8 + lVar14 * 2 + -0x10));
        auVar8 = vminss_avx(auVar39,auVar37);
        auVar35 = ZEXT416(*(uint *)((long)local_3e8 + lVar14 * 2 + -0x18));
        auVar38 = ZEXT416(*(uint *)((long)local_3e8 + lVar14 * 2 + -0xc));
        auVar9 = vminss_avx(auVar35,auVar38);
        auVar34 = vmaxss_avx(auVar34,auVar36);
        auVar39 = vmaxss_avx(auVar39,auVar37);
        auVar35 = vmaxss_avx(auVar35,auVar38);
        auVar36 = ZEXT416(*(uint *)((long)local_3e8 + lVar14 * 2 + -8));
        auVar27 = vminss_avx(auVar27,auVar36);
        auVar37 = ZEXT416(*(uint *)((long)local_3e8 + lVar14 * 2 + -4));
        auVar8 = vminss_avx(auVar8,auVar37);
        auVar27 = vinsertps_avx(auVar27,auVar8,0x10);
        auVar38 = ZEXT416(*(uint *)((long)local_3e8 + lVar14 * 2));
        auVar8 = vminss_avx(auVar9,auVar38);
        auVar34 = vmaxss_avx(auVar34,auVar36);
        auVar39 = vmaxss_avx(auVar39,auVar37);
        auVar34 = vinsertps_avx(auVar34,auVar39,0x10);
        auVar39 = vmaxss_avx(auVar35,auVar38);
        uVar3 = vmovlps_avx(auVar27);
        *(undefined8 *)
         ((long)((local_310.
                  super__Vector_base<bvh::v2::BBox<float,_3UL>,_std::allocator<bvh::v2::BBox<float,_3UL>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->min).values + lVar18 * 2) = uVar3;
        *(int *)((long)((local_310.
                         super__Vector_base<bvh::v2::BBox<float,_3UL>,_std::allocator<bvh::v2::BBox<float,_3UL>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->max).values + lVar18 * 2 + -4)
             = auVar8._0_4_;
        uVar3 = vmovlps_avx(auVar34);
        *(undefined8 *)
         ((long)((local_310.
                  super__Vector_base<bvh::v2::BBox<float,_3UL>,_std::allocator<bvh::v2::BBox<float,_3UL>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->max).values + lVar18 * 2) = uVar3;
        *(int *)((long)((local_310.
                         super__Vector_base<bvh::v2::BBox<float,_3UL>,_std::allocator<bvh::v2::BBox<float,_3UL>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->max).values + lVar18 * 2 + 8) =
             auVar39._0_4_;
        fVar32 = *(float *)((long)local_3e8 + lVar14 * 2 + -0x18);
        fVar31 = *(float *)((long)local_3e8 + lVar14 * 2 + -0xc);
        fVar33 = *(float *)((long)local_3e8 + lVar14 * 2);
        auVar27 = vinsertps_avx(ZEXT416((uint)((*(float *)((long)local_3e8 + lVar14 * 2 + -0x20) +
                                                *(float *)((long)local_3e8 + lVar14 * 2 + -0x14) +
                                               *(float *)((long)local_3e8 + lVar14 * 2 + -8)) *
                                              0.33333334)),
                                ZEXT416((uint)((*(float *)((long)local_3e8 + lVar14 * 2 + -0x1c) +
                                                *(float *)((long)local_3e8 + lVar14 * 2 + -0x10) +
                                               *(float *)((long)local_3e8 + lVar14 * 2 + -4)) *
                                              0.33333334)),0x10);
        uVar3 = vmovlps_avx(auVar27);
        *(undefined8 *)
         ((long)&((__mutex_base *)
                 (local_328.
                  super__Vector_base<bvh::v2::Vec<float,_3UL>,_std::allocator<bvh::v2::Vec<float,_3UL>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->values)->_M_mutex + lVar18) = uVar3;
        *(float *)((long)&(((mutex *)
                           ((long)local_328.
                                  super__Vector_base<bvh::v2::Vec<float,_3UL>,_std::allocator<bvh::v2::Vec<float,_3UL>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + 8))->
                          super___mutex_base)._M_mutex + lVar18) =
             (fVar32 + fVar31 + fVar33) * 0.33333334;
        lVar18 = lVar18 + 0xc;
        lVar14 = lVar14 + 0x12;
        uVar24 = uVar24 - 1;
      } while (uVar24 != 0);
    }
  }
  else {
    uVar16 = uVar24 / (ulong)((long)local_f0 - (long)local_f8 >> 3);
    uVar25 = 0;
    do {
      local_2f8._M_unused._M_object = (void *)0x0;
      local_2f8._8_8_ = 0;
      pcStack_2e8 = (code *)0x0;
      pTStack_2e0 = (ThreadPool *)0x0;
      local_2f8._M_unused._M_object = operator_new(0x28);
      uVar2 = uVar25 + uVar16 + (uVar16 == 0);
      uVar19 = uVar24;
      if (uVar2 < uVar24) {
        uVar19 = uVar2;
      }
      *(vector<bvh::v2::BBox<float,_3UL>,_std::allocator<bvh::v2::BBox<float,_3UL>_>_> **)
       local_2f8._M_unused._0_8_ = &local_310;
      *(void ***)((long)local_2f8._M_unused._0_8_ + 8) = &local_3e8;
      *(vector<bvh::v2::Vec<float,_3UL>,_std::allocator<bvh::v2::Vec<float,_3UL>_>_> **)
       ((long)local_2f8._M_unused._0_8_ + 0x10) = &local_328;
      *(ulong *)((long)local_2f8._M_unused._0_8_ + 0x18) = uVar25;
      *(ulong *)((long)local_2f8._M_unused._0_8_ + 0x20) = uVar19;
      pTStack_2e0 = (ThreadPool *)
                    std::
                    _Function_handler<void_(unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/executor.h:58:30)>
                    ::_M_invoke;
      pcStack_2e8 = std::
                    _Function_handler<void_(unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/executor.h:58:30)>
                    ::_M_manager;
      local_3c8 = (undefined1  [8])(local_128 + 8);
      uStack_3c0 = uStack_3c0 & 0xffffffffffffff00;
      std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_3c8);
      uStack_3c0._0_1_ = 1;
      std::
      deque<std::function<void(unsigned_long)>,std::allocator<std::function<void(unsigned_long)>>>::
      emplace_back<std::function<void(unsigned_long)>>
                (local_80,(function<void_(unsigned_long)> *)&local_2f8);
      std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_3c8);
      std::condition_variable::notify_one();
      if (pcStack_2e8 != (code *)0x0) {
        (*pcStack_2e8)(&local_2f8,&local_2f8,3);
      }
      uVar25 = uVar2;
    } while (uVar2 < uVar24);
    local_2f8._M_unused._0_8_ = (undefined8)(local_128 + 8);
    local_2f8._8_8_ = local_2f8._8_8_ & 0xffffffffffffff00;
    std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)&local_2f8);
    local_2f8._M_pod_data[8] = 1;
    while( true ) {
      if (((float)local_128._0_4_ == 0.0) && (local_50 == local_70)) break;
      std::condition_variable::wait(local_b0);
    }
    std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&local_2f8);
  }
  local_178.sah.log_cluster_size_ = 0;
  local_178.sah.prim_offset_ = 0;
  local_178.sah.cost_ratio_ = 1.0;
  local_178.min_leaf_size = 1;
  local_178.max_leaf_size = 8;
  local_150 = 2;
  local_148 = 0x400;
  __new_size = (code *)(((long)local_310.
                               super__Vector_base<bvh::v2::BBox<float,_3UL>,_std::allocator<bvh::v2::BBox<float,_3UL>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)local_310.
                               super__Vector_base<bvh::v2::BBox<float,_3UL>,_std::allocator<bvh::v2::BBox<float,_3UL>_>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555
                       );
  lVar14 = (long)local_328.
                 super__Vector_base<bvh::v2::Vec<float,_3UL>,_std::allocator<bvh::v2::Vec<float,_3UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)local_328.
                 super__Vector_base<bvh::v2::Vec<float,_3UL>,_std::allocator<bvh::v2::Vec<float,_3UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 2;
  uVar24 = lVar14 * -0x5555555555555555;
  if (__new_size < (code *)0x400) {
    local_3c8 = (undefined1  [8])
                local_328.
                super__Vector_base<bvh::v2::Vec<float,_3UL>,_std::allocator<bvh::v2::Vec<float,_3UL>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
    local_2f8._M_unused._M_object = &PTR___cxa_pure_virtual_00116cf8;
    local_2f8._8_8_ =
         local_310.
         super__Vector_base<bvh::v2::BBox<float,_3UL>,_std::allocator<bvh::v2::BBox<float,_3UL>_>_>.
         _M_impl.super__Vector_impl_data._M_start;
    pTStack_2e0 = (ThreadPool *)
                  local_328.
                  super__Vector_base<bvh::v2::Vec<float,_3UL>,_std::allocator<bvh::v2::Vec<float,_3UL>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    local_2d0 = &local_178;
    uStack_3c0 = uVar24;
    pcStack_2e8 = __new_size;
    local_2d8 = uVar24;
    if (__new_size + lVar14 * 0x5555555555555555 != (code *)0x0) {
      __assert_fail("bboxes.size() == centers.size()",
                    "/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/top_down_sah_builder.h"
                    ,0x3f,
                    "bvh::v2::TopDownSahBuilder<bvh::v2::Node<float, 3>>::TopDownSahBuilder(std::span<const BBox>, std::span<const Vec>, const Config &) [Node = bvh::v2::Node<float, 3>]"
                   );
    }
    local_2f8._M_unused._M_object = &PTR_get_prim_ids_00116d18;
    local_2c8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_2c8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._8_8_ =
         (ulong)(uint)local_2c8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._12_4_ << 0x20;
    local_2c8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_2c8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_offset = 0;
    in_ZmmResult = ZEXT464(0) << 0x40;
    local_2c8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_end_of_storage = (_Bit_pointer)0x0;
    vStack_2a0.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    vStack_2a0.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    vStack_2a0.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    vStack_288.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    uStack_258 = 0;
    uStack_250 = 0;
    uStack_248 = 0;
    vStack_288.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_2c8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
         _M_end_of_storage;
    vStack_288.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)vStack_2a0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_start;
    pfStack_270 = vStack_2a0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_finish;
    pfStack_268 = vStack_2a0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage;
    puStack_260 = vStack_288.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_start;
    std::vector<bool,_std::allocator<bool>_>::resize(&local_2c8,(size_type)__new_size,false);
    std::vector<float,_std::allocator<float>_>::resize(&vStack_2a0,(size_type)__new_size);
    local_388.
    super__Vector_base<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    do {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
                (&vStack_288 +
                 (long)local_388.
                       super__Vector_base<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,(size_type)__new_size);
      puVar15 = (&vStack_288)
                [(long)local_388.
                       super__Vector_base<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start].
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
      puVar6 = (&vStack_288)
               [(long)local_388.
                      super__Vector_base<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start].
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish;
      if (puVar15 != puVar6) {
        uVar23 = 0;
        do {
          *puVar15 = uVar23;
          uVar23 = uVar23 + 1;
          puVar15 = puVar15 + 1;
        } while (puVar15 != puVar6);
      }
      __first._M_current =
           (&vStack_288)
           [(long)local_388.
                  super__Vector_base<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start].
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
      __last._M_current =
           (&vStack_288)
           [(long)local_388.
                  super__Vector_base<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start].
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__first._M_current != __last._M_current) {
        __comp._M_comp.axis = (size_t *)&local_388;
        __comp._M_comp.centers =
             (span<const_bvh::v2::Vec<float,_3UL>,_18446744073709551615UL> *)local_3c8;
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<bvh::v2::SweepSahBuilder<bvh::v2::Node<float,3ul,32ul,4ul>>::SweepSahBuilder(std::span<bvh::v2::BBox<float,3ul>const,18446744073709551615ul>,std::span<bvh::v2::Vec<float,3ul>const,18446744073709551615ul>,bvh::v2::TopDownSahBuilder<bvh::v2::Node<float,3ul,32ul,4ul>>::Config_const&)::_lambda(unsigned_long,unsigned_long)_1_>>
                  (__first,__last,
                   (ulong)(uint)((int)LZCOUNT((long)__last._M_current - (long)__first._M_current >>
                                              3) * 2) ^ 0x7e,__comp);
        __comp_00._M_comp.axis = (size_t *)&local_388;
        __comp_00._M_comp.centers =
             (span<const_bvh::v2::Vec<float,_3UL>,_18446744073709551615UL> *)local_3c8;
        std::
        __final_insertion_sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_comp_iter<bvh::v2::SweepSahBuilder<bvh::v2::Node<float,3ul,32ul,4ul>>::SweepSahBuilder(std::span<bvh::v2::BBox<float,3ul>const,18446744073709551615ul>,std::span<bvh::v2::Vec<float,3ul>const,18446744073709551615ul>,bvh::v2::TopDownSahBuilder<bvh::v2::Node<float,3ul,32ul,4ul>>::Config_const&)::_lambda(unsigned_long,unsigned_long)_1_>>
                  (__first,__last,__comp_00);
      }
      local_388.
      super__Vector_base<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)((long)&((local_388.
                              super__Vector_base<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->nodes).
                            super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + 1);
    } while (local_388.
             super__Vector_base<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start < (pointer)0x3);
    ::bvh::v2::TopDownSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::build
              (&local_1f0,(TopDownSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>_> *)&local_2f8);
    local_2f8._M_unused._M_object = &PTR_get_prim_ids_00116d18;
    lVar14 = 0xb0;
    do {
      pvVar7 = *(void **)((long)&local_310.
                                 super__Vector_base<bvh::v2::BBox<float,_3UL>,_std::allocator<bvh::v2::BBox<float,_3UL>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish + lVar14);
      if (pvVar7 != (void *)0x0) {
        operator_delete(pvVar7,*(long *)((long)&local_2f8 + lVar14) - (long)pvVar7);
      }
      lVar14 = lVar14 + -0x18;
    } while (lVar14 != 0x68);
    if (vStack_2a0.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
        ._M_start != (pointer)0x0) {
      operator_delete(vStack_2a0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)vStack_2a0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)vStack_2a0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_2c8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
      operator_delete(local_2c8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                      (long)local_2c8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_end_of_storage -
                      (long)local_2c8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
      local_2c8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
      .super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      local_2c8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
      .super__Bit_iterator_base._8_8_ =
           local_2c8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._8_8_ & 0xffffffff00000000;
      local_2c8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      local_2c8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_finish.super__Bit_iterator_base._M_offset = 0;
      local_2c8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_end_of_storage = (_Bit_pointer)0x0;
    }
    if (local_150 == 2) {
      local_2f8._0_4_ = 0x3d4ccccd;
      local_2f8._8_8_ = (void *)0x3;
      ::bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::
      optimize<bvh::v2::SequentialExecutor>
                ((Executor<bvh::v2::SequentialExecutor> *)local_3c8,&local_1f0,(Config *)&local_2f8)
      ;
    }
  }
  else {
    local_2f8._M_unused._M_object = (undefined **)0x0;
    local_2f8._8_8_ = (void *)0x0;
    pcStack_2e8 = (code *)CONCAT44(local_178.sah._20_4_,0x3f800000);
    pTStack_2e0 = (ThreadPool *)0x1;
    local_2d8 = 8;
    local_2d0 = (Config *)CONCAT71(local_2d0._1_7_,1);
    local_2d0 = (Config *)CONCAT44(0x3c23d70a,(undefined4)local_2d0);
    local_2c8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x400;
    local_2c8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._8_8_ = 4;
    uStack_3c0 = 0x400;
    local_3b8 = local_310.
                super__Vector_base<bvh::v2::BBox<float,_3UL>,_std::allocator<bvh::v2::BBox<float,_3UL>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
    local_3a8 = (ThreadPool *)
                local_328.
                super__Vector_base<bvh::v2::Vec<float,_3UL>,_std::allocator<bvh::v2::Vec<float,_3UL>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
    local_3c8 = (undefined1  [8])local_128;
    local_3b0 = (size_t)__new_size;
    local_3a0._M_extent_value = uVar24;
    local_398 = &local_2f8;
    if (__new_size + lVar14 * 0x5555555555555555 != (code *)0x0) {
      __assert_fail("bboxes.size() == centers.size()",
                    "/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/mini_tree_builder.h"
                    ,0x9d,
                    "bvh::v2::MiniTreeBuilder<bvh::v2::Node<float, 3>>::MiniTreeBuilder(ThreadPool &, std::span<const BBox>, std::span<const Vec>, const Config &) [Node = bvh::v2::Node<float, 3>, MortonCode = unsigned int]"
                   );
    }
    ::bvh::v2::MiniTreeBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_unsigned_int>::build_mini_trees
              ((vector<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
                *)local_370,
               (MiniTreeBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_unsigned_int> *)local_3c8);
    if ((char)local_2d0 == '\x01') {
      ::bvh::v2::MiniTreeBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_unsigned_int>::
      prune_mini_trees(&local_190,
                       (MiniTreeBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_unsigned_int> *)
                       local_3c8,
                       (vector<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
                        *)local_370);
      local_388.
      super__Vector_base<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = local_360;
      local_388.
      super__Vector_base<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = pBStack_368;
      local_388.
      super__Vector_base<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)local_370;
      local_370 = (undefined1  [8])
                  local_190.
                  super__Vector_base<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      pBStack_368 = local_190.
                    super__Vector_base<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
      local_360 = local_190.
                  super__Vector_base<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_190.
      super__Vector_base<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_190.
      super__Vector_base<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_190.
      super__Vector_base<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::
      vector<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
      ::~vector(&local_388);
      std::
      vector<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
      ::~vector(&local_190);
    }
    ::bvh::v2::MiniTreeBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_unsigned_int>::build_top_bvh
              (&local_1f0,
               (MiniTreeBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_unsigned_int> *)local_3c8,
               (vector<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
                *)local_370);
    std::
    vector<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
    ::~vector((vector<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
               *)local_370);
    if (local_150 == 2) {
      local_3c8._0_4_ = 0x3d4ccccd;
      uStack_3c0 = 3;
      local_2f8._8_8_ = (void *)0x400;
      local_2f8._M_unused._M_object = (ThreadPool *)local_128;
      ::bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::
      optimize<bvh::v2::ParallelExecutor>
                ((Executor<bvh::v2::ParallelExecutor> *)local_2f8._M_pod_data,&local_1f0,
                 (Config *)local_3c8);
    }
  }
  std::vector<bvh::v2::PrecomputedTri<float>,_std::allocator<bvh::v2::PrecomputedTri<float>_>_>::
  vector((vector<bvh::v2::PrecomputedTri<float>,_std::allocator<bvh::v2::PrecomputedTri<float>_>_> *
         )&local_388,((long)pvStack_3e0 - (long)local_3e8 >> 2) * -0x71c71c71c71c71c7,
         (allocator_type *)local_2f8._M_pod_data);
  auVar30 = in_ZmmResult._16_48_;
  uVar24 = ((long)pvStack_3e0 - (long)local_3e8 >> 2) * -0x71c71c71c71c71c7;
  if (uVar24 < 0x400) {
    if (pvStack_3e0 != local_3e8) {
      lVar14 = 0x2c;
      lVar18 = 0;
      do {
        uVar23 = local_1f0.prim_ids.
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar18];
        fVar32 = *(float *)((long)local_3e8 + uVar23 * 0x24);
        fVar31 = *(float *)((long)local_3e8 + uVar23 * 0x24 + 4);
        fVar10 = fVar32 - *(float *)((long)local_3e8 + uVar23 * 0x24 + 0xc);
        fVar11 = fVar31 - *(float *)((long)local_3e8 + uVar23 * 0x24 + 0x10);
        auVar27 = vinsertps_avx(ZEXT416((uint)fVar10),ZEXT416((uint)fVar11),0x10);
        fVar33 = *(float *)((long)local_3e8 + uVar23 * 0x24 + 8);
        fVar12 = fVar33 - *(float *)((long)local_3e8 + uVar23 * 0x24 + 0x14);
        fVar32 = *(float *)((long)local_3e8 + uVar23 * 0x24 + 0x18) - fVar32;
        fVar31 = *(float *)((long)local_3e8 + uVar23 * 0x24 + 0x1c) - fVar31;
        auVar34 = vinsertps_avx(ZEXT416((uint)fVar32),ZEXT416((uint)fVar31),0x10);
        fVar33 = *(float *)((long)local_3e8 + uVar23 * 0x24 + 0x20) - fVar33;
        auVar39 = vfmsub231ss_fma(ZEXT416((uint)(fVar31 * fVar12)),ZEXT416((uint)fVar11),
                                  ZEXT416((uint)fVar33));
        auVar35 = vfmsub231ss_fma(ZEXT416((uint)(fVar33 * fVar10)),ZEXT416((uint)fVar12),
                                  ZEXT416((uint)fVar32));
        auVar39 = vinsertps_avx(auVar39,auVar35,0x10);
        auVar35 = vfmsub231ss_fma(ZEXT416((uint)(fVar32 * fVar11)),ZEXT416((uint)fVar10),
                                  ZEXT416((uint)fVar31));
        uVar3 = *(undefined8 *)((long)local_3e8 + uVar23 * 0x24);
        *(undefined4 *)
         ((long)local_388.
                super__Vector_base<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start + lVar14 + -0x24) =
             *(undefined4 *)((long)local_3e8 + uVar23 * 0x24 + 8);
        *(undefined8 *)
         ((long)local_388.
                super__Vector_base<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start + lVar14 + -0x2c) = uVar3;
        uVar3 = vmovlps_avx(auVar27);
        *(undefined8 *)
         ((long)local_388.
                super__Vector_base<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start + lVar14 + -0x20) = uVar3;
        *(float *)((long)local_388.
                         super__Vector_base<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar14 + -0x18) = fVar12;
        uVar3 = vmovlps_avx(auVar34);
        *(undefined8 *)
         ((long)local_388.
                super__Vector_base<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start + lVar14 + -0x14) = uVar3;
        *(float *)((long)local_388.
                         super__Vector_base<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar14 + -0xc) = fVar33;
        uVar3 = vmovlps_avx(auVar39);
        *(undefined8 *)
         ((long)local_388.
                super__Vector_base<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start + lVar14 + -8) = uVar3;
        *(int *)((long)&((local_388.
                          super__Vector_base<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->nodes).
                        super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + lVar14) = auVar35._0_4_;
        lVar18 = lVar18 + 1;
        lVar14 = lVar14 + 0x30;
      } while (uVar24 - lVar18 != 0);
    }
  }
  else {
    uVar16 = uVar24 / (ulong)((long)local_f0 - (long)local_f8 >> 3);
    uVar25 = 0;
    do {
      local_2f8._M_unused._M_object = (void *)0x0;
      local_2f8._8_8_ = 0;
      pcStack_2e8 = (code *)0x0;
      pTStack_2e0 = (ThreadPool *)0x0;
      local_2f8._M_unused._M_object = operator_new(0x28);
      uVar2 = uVar25 + uVar16 + (uVar16 == 0);
      uVar19 = uVar24;
      if (uVar2 < uVar24) {
        uVar19 = uVar2;
      }
      *(Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_> **)local_2f8._M_unused._0_8_ = &local_1f0;
      *(vector<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
        **)((long)local_2f8._M_unused._0_8_ + 8) = &local_388;
      *(void ***)((long)local_2f8._M_unused._0_8_ + 0x10) = &local_3e8;
      *(ulong *)((long)local_2f8._M_unused._0_8_ + 0x18) = uVar25;
      *(ulong *)((long)local_2f8._M_unused._0_8_ + 0x20) = uVar19;
      pTStack_2e0 = (ThreadPool *)
                    std::
                    _Function_handler<void_(unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/executor.h:58:30)>
                    ::_M_invoke;
      pcStack_2e8 = std::
                    _Function_handler<void_(unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/executor.h:58:30)>
                    ::_M_manager;
      local_3c8 = (undefined1  [8])(local_128 + 8);
      uStack_3c0 = uStack_3c0 & 0xffffffffffffff00;
      std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_3c8);
      uStack_3c0._0_1_ = 1;
      std::
      deque<std::function<void(unsigned_long)>,std::allocator<std::function<void(unsigned_long)>>>::
      emplace_back<std::function<void(unsigned_long)>>
                (local_80,(function<void_(unsigned_long)> *)&local_2f8);
      std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_3c8);
      std::condition_variable::notify_one();
      if (pcStack_2e8 != (code *)0x0) {
        (*pcStack_2e8)(&local_2f8,&local_2f8,3);
      }
      uVar25 = uVar2;
    } while (uVar2 < uVar24);
    local_2f8._M_unused._0_8_ = (undefined8)(local_128 + 8);
    local_2f8._8_8_ = local_2f8._8_8_ & 0xffffffffffffff00;
    std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)&local_2f8);
    local_2f8._M_pod_data[8] = 1;
    while( true ) {
      auVar30 = in_ZmmResult._16_48_;
      if (((float)local_128._0_4_ == 0.0) && (local_50 == local_70)) break;
      std::condition_variable::wait(local_b0);
    }
    std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&local_2f8);
  }
  local_3c8 = (undefined1  [8])0x0;
  uStack_3c0 = 0;
  local_3b8 = (pointer)0x3f80000000000000;
  local_3b0 = 0x42c8000000000000;
  auVar27._8_4_ = 0x7fffffff;
  auVar27._0_8_ = 0x7fffffff7fffffff;
  auVar27._12_4_ = 0x7fffffff;
  auVar27 = vpandd_avx512vl(ZEXT416(0),auVar27);
  auVar39._8_4_ = 0x80000000;
  auVar39._0_8_ = 0x8000000080000000;
  auVar39._12_4_ = 0x80000000;
  auVar35._8_4_ = 0x7f7fffff;
  auVar35._0_8_ = &DAT_7f7fffff7f7fffff;
  auVar35._12_4_ = 0x7f7fffff;
  auVar29._0_16_ = vpternlogd_avx512vl(auVar35,ZEXT416(0),auVar39,0xf8);
  uVar3 = vcmpss_avx512f(auVar27,ZEXT416(0x34000000),6);
  bVar26 = (bool)((byte)uVar3 & 1);
  auVar29._16_48_ = auVar30;
  auVar28._4_60_ = auVar29._4_60_;
  auVar28._0_4_ = (float)((uint)bVar26 * 0x7f800000 + (uint)!bVar26 * auVar29._0_4_);
  local_348 = auVar28._0_4_ * -0.0;
  local_2f8._0_4_ =
       ((local_1f0.nodes.
         super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
         ._M_impl.super__Vector_impl_data._M_start)->index).value;
  local_1f8 = 1;
  local_358 = 0xffffffffffffffff;
  local_138 = auVar28._0_16_;
  local_198 = 0x14;
  local_1a0 = 8;
  local_1a8 = 0x10;
  local_1b0 = 0;
  local_1b8 = 4;
  local_1c0 = 0xc;
  do {
LAB_00103165:
    local_1f8 = local_1f8 - 1;
    uVar24 = (ulong)*(uint *)((long)&local_2f8 + (ulong)local_1f8 * 4);
    while( true ) {
      uVar25 = uVar24 >> 4;
      iVar21 = (int)uVar25;
      if ((uVar24 & 0xf) != 0) break;
      auVar34 = vfmadd132ss_fma(ZEXT416(*(uint *)((long)local_1f0.nodes.
                                                                                                                
                                                  super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[uVar25].
                                                  bounds._M_elems + local_1a0)),
                                ZEXT416((uint)local_348),local_138);
      auVar37 = SUB6416(ZEXT464(0x3f800000),0);
      auVar35 = vfmadd132ss_fma(ZEXT416(*(uint *)((long)local_1f0.nodes.
                                                                                                                
                                                  super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[uVar25].
                                                  bounds._M_elems + local_1a8)),auVar39,auVar37);
      auVar8 = vfmadd132ss_fma(ZEXT416(*(uint *)((long)local_1f0.nodes.
                                                                                                              
                                                  super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[uVar25].
                                                  bounds._M_elems + local_1c0)),
                               ZEXT416((uint)local_348),local_138);
      auVar9 = vfmadd132ss_fma(ZEXT416(*(uint *)((long)local_1f0.nodes.
                                                                                                              
                                                  super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[uVar25].
                                                  bounds._M_elems + local_198)),auVar39,auVar37);
      auVar27 = vmaxss_avx(ZEXT416((uint)(*(float *)((long)local_1f0.nodes.
                                                                                                                      
                                                  super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[uVar25].
                                                  bounds._M_elems + local_1b0) * 3.4028235e+38)),
                           ZEXT416((uint)(float)local_3b0));
      auVar27 = vmaxss_avx(auVar34,auVar27);
      auVar27 = vmaxss_avx(auVar35,auVar27);
      auVar34 = vminss_avx(ZEXT416((uint)(*(float *)((long)local_1f0.nodes.
                                                                                                                      
                                                  super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[uVar25].
                                                  bounds._M_elems + local_1b8) * 3.4028235e+38)),
                           ZEXT416((uint)local_3b0._4_4_));
      auVar34 = vminss_avx(auVar8,auVar34);
      auVar35 = vminss_avx(auVar9,auVar34);
      auVar8 = vfmadd132ss_fma(ZEXT416(*(uint *)((long)local_1f0.nodes.
                                                                                                              
                                                  super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start
                                                  [uVar25 + 1].bounds._M_elems + local_1a0)),
                               ZEXT416((uint)local_348),local_138);
      auVar9 = vfmadd132ss_fma(ZEXT416(*(uint *)((long)local_1f0.nodes.
                                                                                                              
                                                  super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start
                                                  [uVar25 + 1].bounds._M_elems + local_1a8)),auVar39
                               ,auVar37);
      auVar36 = vfmadd132ss_fma(ZEXT416(*(uint *)((long)local_1f0.nodes.
                                                                                                                
                                                  super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start
                                                  [uVar25 + 1].bounds._M_elems + local_1c0)),
                                ZEXT416((uint)local_348),local_138);
      auVar37 = vfmadd132ss_fma(ZEXT416(*(uint *)((long)local_1f0.nodes.
                                                                                                                
                                                  super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start
                                                  [uVar25 + 1].bounds._M_elems + local_198)),auVar39
                                ,auVar37);
      auVar34 = vmaxss_avx(ZEXT416((uint)(*(float *)((long)local_1f0.nodes.
                                                                                                                      
                                                  super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start
                                                  [uVar25 + 1].bounds._M_elems + local_1b0) *
                                         3.4028235e+38)),ZEXT416((uint)(float)local_3b0));
      auVar34 = vmaxss_avx(auVar8,auVar34);
      auVar34 = vmaxss_avx(auVar9,auVar34);
      auVar8 = vminss_avx(ZEXT416((uint)(*(float *)((long)local_1f0.nodes.
                                                                                                                    
                                                  super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start
                                                  [uVar25 + 1].bounds._M_elems + local_1b8) *
                                        3.4028235e+38)),ZEXT416((uint)local_3b0._4_4_));
      auVar8 = vminss_avx(auVar36,auVar8);
      auVar8 = vminss_avx(auVar37,auVar8);
      fVar32 = auVar34._0_4_;
      if (auVar27._0_4_ <= auVar35._0_4_) {
        uVar5 = local_1f0.nodes.
                super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar25].index.value;
        uVar24 = (ulong)uVar5;
        bVar26 = true;
        if (fVar32 <= auVar8._0_4_) {
          uVar16 = (ulong)local_1f8;
          if (0x3f < uVar16) {
            __assert_fail("!is_full()",
                          "/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/stack.h"
                          ,0x15,
                          "void bvh::v2::SmallStack<bvh::v2::Index<32, 4>, 64>::push(const T &) [T = bvh::v2::Index<32, 4>, Capacity = 64]"
                         );
          }
          uVar22 = local_1f0.nodes.
                   super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar25 + 1].index.value;
          if (fVar32 < auVar27._0_4_) {
            uVar24 = (ulong)uVar22;
            uVar22 = uVar5;
          }
          local_1f8 = local_1f8 + 1;
          *(uint *)((long)&local_2f8 + uVar16 * 4) = uVar22;
        }
      }
      else if (auVar8._0_4_ < fVar32) {
        bVar26 = false;
      }
      else {
        uVar24 = (ulong)local_1f0.nodes.
                        super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[uVar25 + 1].index.value;
        bVar26 = true;
      }
      if (!bVar26) goto LAB_001032a2;
    }
    uVar16 = (ulong)(uint)(iVar21 << 4);
    lVar14 = uVar16 * 3 + 0x18;
    lVar18 = uVar16 * 3 + 0xc;
    do {
      pBVar13 = local_388.
                super__Vector_base<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pBVar4 = local_388.
               super__Vector_base<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + uVar25;
      puVar1 = (undefined1 *)
               ((long)&(pBVar4->prim_ids).
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_finish + 4);
      auVar27 = vinsertps_avx(ZEXT416((uint)(*(float *)&(pBVar4->nodes).
                                                                                                                
                                                  super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start -
                                            (float)local_3c8._0_4_)),
                              ZEXT416((uint)(*(float *)((long)&(pBVar4->nodes).
                                                                                                                              
                                                  super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start + 4) -
                                            (float)local_3c8._4_4_)),0x10);
      fVar32 = *(float *)&(pBVar4->nodes).
                          super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (float)uStack_3c0;
      pBVar4 = (pointer)vmovlps_avx(auVar27);
      pBStack_368 = (pointer)CONCAT44(pBStack_368._4_4_,fVar32);
      local_370._0_4_ = SUB84(pBVar4,0);
      local_370._4_4_ = (undefined4)((ulong)pBVar4 >> 0x20);
      auVar27 = vfmsub231ss_fma(ZEXT416((uint)((float)local_370._4_4_ * local_3b8._4_4_)),
                                ZEXT416((uint)(float)local_3b8),ZEXT416((uint)fVar32));
      auVar34 = vfmsub231ss_fma(ZEXT416((uint)(fVar32 * uStack_3c0._4_4_)),
                                ZEXT416((uint)local_370._0_4_),ZEXT416((uint)local_3b8._4_4_));
      auVar27 = vinsertps_avx(auVar27,auVar34,0x10);
      auVar34 = vfmsub231ss_fma(ZEXT416((uint)((float)local_370._0_4_ * (float)local_3b8)),
                                ZEXT416((uint)uStack_3c0._4_4_),ZEXT416((uint)local_370._4_4_));
      local_190.
      super__Vector_base<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)vmovlps_avx(auVar27);
      local_190.
      super__Vector_base<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           (pointer)CONCAT44(local_190.
                             super__Vector_base<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish._4_4_,auVar34._0_4_);
      local_350 = local_388.
                  super__Vector_base<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + uVar25 + 1;
      local_370 = (undefined1  [8])pBVar4;
      fVar31 = std::
               transform_reduce<float_const*,float_const*,float,std::plus<void>,std::multiplies<void>>
                         (0,puVar1,local_350,(long)&uStack_3c0 + 4);
      pBVar4 = local_350;
      fVar32 = 0.0;
      lVar20 = 0;
      do {
        fVar32 = fVar32 + *(float *)((long)&local_190.
                                            super__Vector_base<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start + lVar20) *
                          *(float *)((long)&(pBVar13->nodes).
                                            super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start +
                                    lVar20 + lVar14);
        lVar20 = lVar20 + 4;
      } while (lVar20 != 0xc);
      fVar33 = 0.0;
      lVar20 = 0;
      do {
        fVar33 = fVar33 + *(float *)((long)&local_190.
                                            super__Vector_base<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start + lVar20) *
                          *(float *)((long)&(pBVar13->nodes).
                                            super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start +
                                    lVar20 + lVar18);
        lVar20 = lVar20 + 4;
      } while (lVar20 != 0xc);
      fVar31 = 1.0 / fVar31;
      fVar32 = fVar31 * fVar32;
      bVar26 = false;
      if (((-1.1920929e-07 <= fVar32) && (fVar33 = fVar31 * fVar33, -1.1920929e-07 <= fVar33)) &&
         (-1.1920929e-07 <= (1.0 - fVar32) - fVar33)) {
        local_350 = (pointer)CONCAT44(local_350._4_4_,fVar31);
        local_33c = fVar33;
        local_338 = fVar32;
        fVar32 = std::
                 transform_reduce<float_const*,float_const*,float,std::plus<void>,std::multiplies<void>>
                           (0,puVar1,pBVar4,local_370);
        fVar32 = fVar32 * local_350._0_4_;
        bVar26 = false;
        if (((float)local_3b0 <= fVar32) && (fVar32 <= local_3b0._4_4_)) {
          bVar26 = true;
          local_32c = local_338;
          local_330 = local_33c;
          local_334 = fVar32;
        }
      }
      if (bVar26) {
        local_3b0._4_4_ = local_334;
        local_344 = local_32c;
        local_340 = local_330;
        local_358 = uVar25;
      }
      uVar25 = uVar25 + 1;
      lVar14 = lVar14 + 0x30;
      lVar18 = lVar18 + 0x30;
    } while (uVar25 != ((uint)uVar24 & 0xf) + iVar21);
    auVar39._8_4_ = 0x80000000;
    auVar39._0_8_ = 0x8000000080000000;
    auVar39._12_4_ = 0x80000000;
    if (local_1f8 == 0) goto LAB_00103556;
  } while( true );
LAB_001032a2:
  if (local_1f8 == 0) {
LAB_00103556:
    bVar26 = local_358 == 0xffffffffffffffff;
    if (bVar26) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"No intersection found",0x15);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x30);
      std::ostream::put(-0x30);
      std::ostream::flush();
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Intersection found\n",0x13);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  primitive: ",0xd);
      poVar17 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>(poVar17,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar17,"  distance: ",0xc);
      poVar17 = std::ostream::_M_insert<double>((double)local_3b0._4_4_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar17,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar17,"  barycentric coords.: ",0x17);
      poVar17 = std::ostream::_M_insert<double>((double)local_344);
      std::__ostream_insert<char,std::char_traits<char>>(poVar17,", ",2);
      poVar17 = std::ostream::_M_insert<double>((double)local_340);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar17 + -0x18) + (char)poVar17);
      std::ostream::put((char)poVar17);
      std::ostream::flush();
    }
    if (local_388.
        super__Vector_base<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_388.
                      super__Vector_base<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_388.
                            super__Vector_base<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_388.
                            super__Vector_base<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>,_std::allocator<bvh::v2::Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_1f0.prim_ids.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
        .super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1f0.prim_ids.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_1f0.prim_ids.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_1f0.prim_ids.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_1f0.nodes.
        super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1f0.nodes.
                      super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_1f0.nodes.
                            super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_1f0.nodes.
                            super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if ((ThreadPool *)
        local_328.
        super__Vector_base<bvh::v2::Vec<float,_3UL>,_std::allocator<bvh::v2::Vec<float,_3UL>_>_>.
        _M_impl.super__Vector_impl_data._M_start != (ThreadPool *)0x0) {
      operator_delete(local_328.
                      super__Vector_base<bvh::v2::Vec<float,_3UL>,_std::allocator<bvh::v2::Vec<float,_3UL>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_328.
                            super__Vector_base<bvh::v2::Vec<float,_3UL>,_std::allocator<bvh::v2::Vec<float,_3UL>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_328.
                            super__Vector_base<bvh::v2::Vec<float,_3UL>,_std::allocator<bvh::v2::Vec<float,_3UL>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_310.
        super__Vector_base<bvh::v2::BBox<float,_3UL>,_std::allocator<bvh::v2::BBox<float,_3UL>_>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_310.
                      super__Vector_base<bvh::v2::BBox<float,_3UL>,_std::allocator<bvh::v2::BBox<float,_3UL>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_310.
                            super__Vector_base<bvh::v2::BBox<float,_3UL>,_std::allocator<bvh::v2::BBox<float,_3UL>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_310.
                            super__Vector_base<bvh::v2::BBox<float,_3UL>,_std::allocator<bvh::v2::BBox<float,_3UL>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    ::bvh::v2::ThreadPool::~ThreadPool((ThreadPool *)local_128);
    if (local_3e8 != (void *)0x0) {
      operator_delete(local_3e8,local_3d8 - (long)local_3e8);
    }
    return (uint)bVar26;
  }
  goto LAB_00103165;
}

Assistant:

int main() {
    // This is the original data, which may come in some other data type/structure.
    std::vector<Tri> tris;
    tris.emplace_back(
        Vec3( 1.0, -1.0, 1.0),
        Vec3( 1.0,  1.0, 1.0),
        Vec3(-1.0,  1.0, 1.0)
    );
    tris.emplace_back(
        Vec3( 1.0, -1.0, 1.0),
        Vec3(-1.0, -1.0, 1.0),
        Vec3(-1.0,  1.0, 1.0)
    );

    bvh::v2::ThreadPool thread_pool;
    bvh::v2::ParallelExecutor executor(thread_pool);

    // Get triangle centers and bounding boxes (required for BVH builder)
    std::vector<BBox> bboxes(tris.size());
    std::vector<Vec3> centers(tris.size());
    executor.for_each(0, tris.size(), [&] (size_t begin, size_t end) {
        for (size_t i = begin; i < end; ++i) {
            bboxes[i]  = tris[i].get_bbox();
            centers[i] = tris[i].get_center();
        }
    });

    typename bvh::v2::DefaultBuilder<Node>::Config config;
    config.quality = bvh::v2::DefaultBuilder<Node>::Quality::High;
    auto bvh = bvh::v2::DefaultBuilder<Node>::build(thread_pool, bboxes, centers, config);

    // Permuting the primitive data allows to remove indirections during traversal, which makes it faster.
    static constexpr bool should_permute = true;

    // This precomputes some data to speed up traversal further.
    std::vector<PrecomputedTri> precomputed_tris(tris.size());
    executor.for_each(0, tris.size(), [&] (size_t begin, size_t end) {
        for (size_t i = begin; i < end; ++i) {
            auto j = should_permute ? bvh.prim_ids[i] : i;
            precomputed_tris[i] = tris[j];
        }
    });

    auto ray = Ray {
        Vec3(0., 0., 0.), // Ray origin
        Vec3(0., 0., 1.), // Ray direction
        0.,               // Minimum intersection distance
        100.              // Maximum intersection distance
    };

    static constexpr size_t invalid_id = std::numeric_limits<size_t>::max();
    static constexpr size_t stack_size = 64;
    static constexpr bool use_robust_traversal = false;

    auto prim_id = invalid_id;
    Scalar u, v;

    // Traverse the BVH and get the u, v coordinates of the closest intersection.
    bvh::v2::SmallStack<Bvh::Index, stack_size> stack;
    bvh.intersect<false, use_robust_traversal>(ray, bvh.get_root().index, stack,
        [&] (size_t begin, size_t end) {
            for (size_t i = begin; i < end; ++i) {
                size_t j = should_permute ? i : bvh.prim_ids[i];
                if (auto hit = precomputed_tris[j].intersect(ray)) {
                    prim_id = i;
                    std::tie(ray.tmax, u, v) = *hit;
                }
            }
            return prim_id != invalid_id;
        });

    if (prim_id != invalid_id) {
        std::cout
            << "Intersection found\n"
            << "  primitive: " << prim_id << "\n"
            << "  distance: " << ray.tmax << "\n"
            << "  barycentric coords.: " << u << ", " << v << std::endl;
        return 0;
    } else {
        std::cout << "No intersection found" << std::endl;
        return 1;
    }
}